

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata.h
# Opt level: O2

void __thiscall aiMetadata::Add<aiString>(aiMetadata *this,string *key,aiString *value)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  uint uVar3;
  uint uVar4;
  undefined8 uVar5;
  aiString *paVar6;
  aiMetadataEntry *paVar7;
  ulong uVar8;
  long lVar9;
  aiMetadataEntry *paVar10;
  long lVar11;
  aiString *paVar12;
  
  uVar3 = this->mNumProperties;
  uVar8 = (ulong)(uVar3 + 1);
  paVar6 = (aiString *)operator_new__(uVar8 * 0x404);
  if (uVar3 != 0xffffffff) {
    paVar12 = paVar6;
    do {
      paVar12->length = 0;
      paVar12->data[0] = '\0';
      memset(paVar12->data + 1,0x1b,0x3ff);
      paVar12 = paVar12 + 1;
    } while (paVar12 != paVar6 + uVar8);
  }
  paVar7 = (aiMetadataEntry *)operator_new__(uVar8 << 4);
  paVar12 = this->mKeys;
  paVar10 = this->mValues;
  lVar11 = 4;
  for (lVar9 = 0; (ulong)uVar3 << 4 != lVar9; lVar9 = lVar9 + 0x10) {
    if (paVar6 != paVar12) {
      uVar4 = *(uint *)(paVar12->data + lVar11 + -8);
      *(uint *)(paVar6->data + lVar11 + -8) = uVar4;
      memcpy(paVar6->data + lVar11 + -4,paVar12->data + lVar11 + -4,(ulong)uVar4);
      (paVar6->data + lVar11 + -4)[uVar4] = '\0';
    }
    puVar1 = (undefined8 *)((long)&paVar10->mType + lVar9);
    uVar5 = puVar1[1];
    puVar2 = (undefined8 *)((long)&paVar7->mType + lVar9);
    *puVar2 = *puVar1;
    puVar2[1] = uVar5;
    lVar11 = lVar11 + 0x404;
  }
  if (paVar12 != (aiString *)0x0) {
    operator_delete__(paVar12);
    paVar10 = this->mValues;
  }
  if (paVar10 != (aiMetadataEntry *)0x0) {
    operator_delete__(paVar10);
  }
  this->mKeys = paVar6;
  this->mValues = paVar7;
  uVar3 = this->mNumProperties;
  this->mNumProperties = uVar3 + 1;
  Set<aiString>(this,uVar3,key,value);
  return;
}

Assistant:

inline
    void Add(const std::string& key, const T& value) {
		aiString* new_keys = new aiString[mNumProperties + 1];
		aiMetadataEntry* new_values = new aiMetadataEntry[mNumProperties + 1];

		for(unsigned int i = 0; i < mNumProperties; ++i)
		{
			new_keys[i] = mKeys[i];
			new_values[i] = mValues[i];
		}

		delete[] mKeys;
		delete[] mValues;

		mKeys = new_keys;
		mValues = new_values;

		mNumProperties++;

		Set(mNumProperties - 1, key, value);
	}